

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLoadXYZROTnodeXYZROTnode::ComputeQ
          (ChLoadXYZROTnodeXYZROTnode *this,ChState *state_x,ChStateDelta *state_w)

{
  double *pdVar1;
  ulong *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  element_type *peVar6;
  double *pdVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  long lVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  undefined1 auVar50 [32];
  uint uVar23;
  pointer psVar24;
  ulong uVar25;
  undefined1 auVar51 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  double dVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  ChVector<double> v;
  ChVector<double> abs_force;
  ChFrameMoving<double> rel_AB;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4b8;
  ulong local_4b0;
  ulong local_4a8;
  ulong local_4a0;
  ulong local_498;
  ulong local_490;
  ChQuaternion<double> local_480;
  ulong local_460;
  ulong local_458;
  double local_450;
  ulong local_448;
  ulong local_440;
  ChFrameMoving<double> local_438;
  ChFrameMoving<double> local_338;
  ChVector<double> local_238;
  ChFrameMoving<double> local_220;
  ChFrameMoving<double> local_128;
  
  psVar24 = (this->super_ChLoadCustomMultiple).loadables.
            super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar6 = (psVar24->super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar6 == (element_type *)0x0) {
LAB_0063d537:
    local_4b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar18 = 0;
  }
  else {
    lVar18 = __dynamic_cast(peVar6,&ChLoadable::typeinfo,&ChBody::typeinfo,0xffffffffffffffff);
    if (lVar18 == 0) goto LAB_0063d537;
    local_4b8 = (psVar24->super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
    if (local_4b8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_4b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else if (__libc_single_threaded == '\0') {
      LOCK();
      local_4b8->_M_use_count = local_4b8->_M_use_count + 1;
      UNLOCK();
      psVar24 = (this->super_ChLoadCustomMultiple).loadables.
                super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      local_4b8->_M_use_count = local_4b8->_M_use_count + 1;
    }
  }
  peVar6 = psVar24[1].super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar6 == (element_type *)0x0) {
LAB_0063d595:
    local_4c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar19 = 0;
  }
  else {
    lVar19 = __dynamic_cast(peVar6,&ChLoadable::typeinfo,&ChBody::typeinfo,0xffffffffffffffff);
    if (lVar19 == 0) goto LAB_0063d595;
    local_4c0 = psVar24[1].super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_4c0 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_4c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else if (__libc_single_threaded == '\0') {
      LOCK();
      local_4c0->_M_use_count = local_4c0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_4c0->_M_use_count = local_4c0->_M_use_count + 1;
    }
  }
  local_220.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_338.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_338.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x0;
  local_338.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_220.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_220.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_220.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&local_128,(ChVector<double> *)&local_338,(ChQuaternion<double> *)&local_220);
  local_338.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_438.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_438.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x0;
  local_438.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_338.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_338.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_338.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&local_220,(ChVector<double> *)&local_438,(ChQuaternion<double> *)&local_338);
  if (state_x == (ChState *)0x0) {
    ChFrame<double>::SetCoord
              (&local_128.super_ChFrame<double>,(ChCoordsys<double> *)(lVar18 + 0x80));
    ChFrame<double>::SetCoord
              (&local_220.super_ChFrame<double>,(ChCoordsys<double> *)(lVar19 + 0x80));
  }
  else {
    local_438.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         (state_x->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_438.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_438.super_ChFrame<double>.coord.pos.m_data[0] = 3.45845952088873e-323;
    local_438.super_ChFrame<double>.coord.rot.m_data[0] = 0.0;
    local_438.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_x;
    if ((long)local_438.super_ChFrame<double>.coord.rot.m_data[2] < 7) goto LAB_0063e458;
    ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChCoordsys<double> *)&local_338,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_438,(type *)0x0);
    ChFrame<double>::SetCoord(&local_128.super_ChFrame<double>,(ChCoordsys<double> *)&local_338);
    local_438.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_438.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         ((state_x->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 7);
    local_438.super_ChFrame<double>.coord.pos.m_data[0] = 3.45845952088873e-323;
    local_438.super_ChFrame<double>.coord.rot.m_data[0] = 3.45845952088873e-323;
    local_438.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_x;
    if ((long)local_438.super_ChFrame<double>.coord.rot.m_data[2] < 0xe) goto LAB_0063e458;
    ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChCoordsys<double> *)&local_338,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_438,(type *)0x0);
    ChFrame<double>::SetCoord(&local_220.super_ChFrame<double>,(ChCoordsys<double> *)&local_338);
  }
  if (state_w == (ChStateDelta *)0x0) {
    if (&local_128.coord_dt != (ChCoordsys<double> *)(lVar18 + 0x100)) {
      local_128.coord_dt.pos.m_data[0] = *(double *)(lVar18 + 0x100);
      local_128.coord_dt.pos.m_data[1] = *(double *)(lVar18 + 0x108);
      local_128.coord_dt.pos.m_data[2] = *(double *)(lVar18 + 0x110);
      local_128.coord_dt.rot.m_data[0] = *(double *)(lVar18 + 0x118);
      local_128.coord_dt.rot.m_data[1] = *(double *)(lVar18 + 0x120);
      local_128.coord_dt.rot.m_data[2] = *(double *)(lVar18 + 0x128);
      local_128.coord_dt.rot.m_data[3] = *(double *)(lVar18 + 0x130);
    }
    if (&local_220.coord_dt != (ChCoordsys<double> *)(lVar19 + 0x100)) {
      local_220.coord_dt.pos.m_data[0] = *(double *)(lVar19 + 0x100);
      local_220.coord_dt.pos.m_data[1] = *(double *)(lVar19 + 0x108);
      local_220.coord_dt.pos.m_data[2] = *(double *)(lVar19 + 0x110);
      local_220.coord_dt.rot.m_data[0] = *(double *)(lVar19 + 0x118);
      local_220.coord_dt.rot.m_data[1] = *(double *)(lVar19 + 0x120);
      local_220.coord_dt.rot.m_data[2] = *(double *)(lVar19 + 0x128);
      local_220.coord_dt.rot.m_data[3] = *(double *)(lVar19 + 0x130);
    }
  }
  else {
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         (state_w->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 0.0;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_w;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 3) goto LAB_0063e458;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&local_438,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    local_128.coord_dt.pos.m_data[0] = (double)local_438.super_ChFrame<double>._vptr_ChFrame;
    local_128.coord_dt.pos.m_data[1] = local_438.super_ChFrame<double>.coord.pos.m_data[0];
    local_128.coord_dt.pos.m_data[2] = local_438.super_ChFrame<double>.coord.pos.m_data[1];
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         ((state_w->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3);
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_w;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 6) goto LAB_0063e458;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&local_438,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    ChFrameMoving<double>::SetWvel_loc(&local_128,(ChVector<double> *)&local_438);
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         ((state_w->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 6);
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 2.96439387504748e-323;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_w;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 9) goto LAB_0063e458;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&local_438,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    local_220.coord_dt.pos.m_data[0] = (double)local_438.super_ChFrame<double>._vptr_ChFrame;
    local_220.coord_dt.pos.m_data[1] = local_438.super_ChFrame<double>.coord.pos.m_data[0];
    local_220.coord_dt.pos.m_data[2] = local_438.super_ChFrame<double>.coord.pos.m_data[1];
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         ((state_w->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 9);
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 4.44659081257122e-323;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_w;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 0xc) goto LAB_0063e458;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&local_438,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    ChFrameMoving<double>::SetWvel_loc(&local_220,(ChVector<double> *)&local_438);
  }
  local_438.super_ChFrame<double>.coord.pos.m_data[0] =
       (this->loc_application_A).coord.pos.m_data[0];
  local_438.super_ChFrame<double>.coord.pos.m_data[1] =
       (this->loc_application_A).coord.pos.m_data[1];
  local_438.super_ChFrame<double>.coord.pos.m_data[2] =
       (this->loc_application_A).coord.pos.m_data[2];
  local_438.super_ChFrame<double>.coord.rot.m_data[0] =
       (this->loc_application_A).coord.rot.m_data[0];
  local_438.super_ChFrame<double>.coord.rot.m_data[1] =
       (this->loc_application_A).coord.rot.m_data[1];
  local_438.super_ChFrame<double>.coord.rot.m_data[2] =
       (this->loc_application_A).coord.rot.m_data[2];
  local_438.super_ChFrame<double>.coord.rot.m_data[3] =
       (this->loc_application_A).coord.rot.m_data[3];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_480.m_data[0] = 1.0;
  local_438.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b036f0;
  local_438.coord_dt.pos.m_data[0] = 0.0;
  local_438.coord_dt.pos.m_data[1] = 0.0;
  local_438.coord_dt.pos.m_data[2] = 0.0;
  local_438.coord_dt.rot.m_data[0] = 0.0;
  local_438.coord_dt.rot.m_data[1] = 0.0;
  local_438.coord_dt.rot.m_data[2] = 0.0;
  local_438.coord_dt.rot.m_data[3] = 0.0;
  local_438.coord_dtdt.pos.m_data[0] = 0.0;
  local_438.coord_dtdt.pos.m_data[1] = 0.0;
  local_438.coord_dtdt.pos.m_data[2] = 0.0;
  local_438.coord_dtdt.rot.m_data[0] = 0.0;
  local_438.coord_dtdt.rot.m_data[1] = 0.0;
  local_438.coord_dtdt.rot.m_data[2] = 0.0;
  local_438.coord_dtdt.rot.m_data[3] = 0.0;
  local_238.m_data[2] = 0.0;
  local_480.m_data[3] = 0.0;
  local_238.m_data[0] = 0.0;
  local_238.m_data[1] = 0.0;
  local_480.m_data[1] = 0.0;
  local_480.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&local_338,&local_238,&local_480);
  ChFrameMoving<double>::TransformLocalToParent(&local_128,&local_438,&local_338);
  ChFrameMoving<double>::operator=(&this->frame_Aw,&local_338);
  local_438.super_ChFrame<double>.coord.pos.m_data[0] =
       (this->loc_application_B).coord.pos.m_data[0];
  local_438.super_ChFrame<double>.coord.pos.m_data[1] =
       (this->loc_application_B).coord.pos.m_data[1];
  local_438.super_ChFrame<double>.coord.pos.m_data[2] =
       (this->loc_application_B).coord.pos.m_data[2];
  local_438.super_ChFrame<double>.coord.rot.m_data[0] =
       (this->loc_application_B).coord.rot.m_data[0];
  local_438.super_ChFrame<double>.coord.rot.m_data[1] =
       (this->loc_application_B).coord.rot.m_data[1];
  local_438.super_ChFrame<double>.coord.rot.m_data[2] =
       (this->loc_application_B).coord.rot.m_data[2];
  local_438.super_ChFrame<double>.coord.rot.m_data[3] =
       (this->loc_application_B).coord.rot.m_data[3];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_480.m_data[0] = 1.0;
  local_438.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b036f0;
  local_438.coord_dt.pos.m_data[0] = 0.0;
  local_438.coord_dt.pos.m_data[1] = 0.0;
  local_438.coord_dt.pos.m_data[2] = 0.0;
  local_438.coord_dt.rot.m_data[0] = 0.0;
  local_438.coord_dt.rot.m_data[1] = 0.0;
  local_438.coord_dt.rot.m_data[2] = 0.0;
  local_438.coord_dt.rot.m_data[3] = 0.0;
  local_438.coord_dtdt.pos.m_data[0] = 0.0;
  local_438.coord_dtdt.pos.m_data[1] = 0.0;
  local_438.coord_dtdt.pos.m_data[2] = 0.0;
  local_438.coord_dtdt.rot.m_data[0] = 0.0;
  local_438.coord_dtdt.rot.m_data[1] = 0.0;
  local_438.coord_dtdt.rot.m_data[2] = 0.0;
  local_438.coord_dtdt.rot.m_data[3] = 0.0;
  local_238.m_data[2] = 0.0;
  local_480.m_data[3] = 0.0;
  local_238.m_data[0] = 0.0;
  local_238.m_data[1] = 0.0;
  local_480.m_data[1] = 0.0;
  local_480.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&local_338,&local_238,&local_480);
  ChFrameMoving<double>::TransformLocalToParent(&local_220,&local_438,&local_338);
  ChFrameMoving<double>::operator=(&this->frame_Bw,&local_338);
  local_438.super_ChFrame<double>.coord.pos.m_data[0] =
       (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[0];
  local_438.super_ChFrame<double>.coord.pos.m_data[1] =
       (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[1];
  local_438.super_ChFrame<double>.coord.pos.m_data[2] =
       (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[2];
  local_438.super_ChFrame<double>.coord.rot.m_data[0] =
       (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[0];
  local_438.super_ChFrame<double>.coord.rot.m_data[1] =
       (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[1];
  local_438.super_ChFrame<double>.coord.rot.m_data[2] =
       (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[2];
  local_438.super_ChFrame<double>.coord.rot.m_data[3] =
       (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[3];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_438.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b036f0;
  local_438.coord_dt.pos.m_data[0] = (this->frame_Bw).coord_dt.pos.m_data[0];
  local_438.coord_dt.pos.m_data[1] = (this->frame_Bw).coord_dt.pos.m_data[1];
  local_438.coord_dt.pos.m_data[2] = (this->frame_Bw).coord_dt.pos.m_data[2];
  local_438.coord_dt.rot.m_data[0] = (this->frame_Bw).coord_dt.rot.m_data[0];
  local_438.coord_dt.rot.m_data[1] = (this->frame_Bw).coord_dt.rot.m_data[1];
  local_438.coord_dt.rot.m_data[2] = (this->frame_Bw).coord_dt.rot.m_data[2];
  local_438.coord_dt.rot.m_data[3] = (this->frame_Bw).coord_dt.rot.m_data[3];
  local_438.coord_dtdt.pos.m_data[0] = (this->frame_Bw).coord_dtdt.pos.m_data[0];
  local_438.coord_dtdt.pos.m_data[1] = (this->frame_Bw).coord_dtdt.pos.m_data[1];
  local_438.coord_dtdt.pos.m_data[2] = (this->frame_Bw).coord_dtdt.pos.m_data[2];
  local_438.coord_dtdt.rot.m_data[0] = (this->frame_Bw).coord_dtdt.rot.m_data[0];
  local_438.coord_dtdt.rot.m_data[1] = (this->frame_Bw).coord_dtdt.rot.m_data[1];
  local_438.coord_dtdt.rot.m_data[2] = (this->frame_Bw).coord_dtdt.rot.m_data[2];
  local_438.coord_dtdt.rot.m_data[3] = (this->frame_Bw).coord_dtdt.rot.m_data[3];
  ChFrameMoving<double>::Invert(&local_438);
  local_480.m_data[0] = 1.0;
  local_238.m_data[0] = 0.0;
  local_238.m_data[1] = 0.0;
  local_238.m_data[2] = 0.0;
  local_480.m_data[1] = 0.0;
  local_480.m_data[2] = 0.0;
  local_480.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&local_338,&local_238,&local_480);
  ChFrameMoving<double>::TransformLocalToParent(&local_438,&this->frame_Aw,&local_338);
  (*(this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj[0x16])
            (this,&local_338,&this->locB_force,&this->locB_torque);
  dVar3 = (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar3;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = (this->locB_force).m_data[1];
  dVar62 = (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar62;
  dVar4 = (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar4;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = (this->locB_force).m_data[0];
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = (this->locB_force).m_data[2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar26 = vmulsd_avx512f(auVar32,auVar38);
  auVar27 = vmulsd_avx512f(auVar38,auVar35);
  auVar28 = vmulsd_avx512f(auVar38,auVar36);
  auVar26 = vfmadd231sd_avx512f(auVar26,auVar31,auVar37);
  auVar27 = vfmadd231sd_avx512f(auVar27,auVar33,auVar37);
  auVar28 = vfmadd231sd_avx512f(auVar28,auVar34,auVar37);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar26 = vfmadd231sd_avx512f(auVar26,auVar41,auVar39);
  auVar96._8_8_ = 0;
  auVar96._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar27 = vfmadd231sd_avx512f(auVar27,auVar96,auVar39);
  auVar28 = vfmadd231sd_avx512f(auVar28,auVar40,auVar39);
  vmovsd_avx512f(auVar26);
  vmovsd_avx512f(auVar27);
  vmovsd_avx512f(auVar28);
  uVar22 = (this->super_ChLoadCustomMultiple).load_Q.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if ((long)uVar22 < 3) goto LAB_0063e458;
  dVar5 = (this->locB_torque).m_data[1];
  auVar77._8_8_ = 0;
  auVar77._0_8_ = (this->locB_torque).m_data[0];
  pdVar7 = (this->super_ChLoadCustomMultiple).load_Q.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  uVar23 = 3;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar3 * dVar5;
  auVar31 = vfmadd213sd_fma(auVar31,auVar77,auVar63);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = (this->locB_torque).m_data[2];
  auVar29 = vfmadd213sd_avx512f(auVar41,auVar64,auVar31);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar62 * dVar5;
  auVar31 = vfmadd213sd_fma(auVar33,auVar77,auVar55);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar4 * dVar5;
  auVar32 = vfmadd213sd_fma(auVar34,auVar77,auVar56);
  auVar30 = vfmadd213sd_avx512f(auVar96,auVar64,auVar31);
  auVar31 = vfmadd213sd_fma(auVar40,auVar64,auVar32);
  local_460 = auVar31._0_8_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       (this->frame_Aw).super_ChFrame<double>.coord.pos.m_data[2] -
       local_128.super_ChFrame<double>.coord.pos.m_data[2];
  auVar31 = vmulsd_avx512f(auVar27,auVar70);
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       (this->frame_Aw).super_ChFrame<double>.coord.pos.m_data[0] -
       local_128.super_ChFrame<double>.coord.pos.m_data[0];
  auVar32 = vmulsd_avx512f(auVar28,auVar65);
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       (this->frame_Aw).super_ChFrame<double>.coord.pos.m_data[1] -
       local_128.super_ChFrame<double>.coord.pos.m_data[1];
  auVar33 = vfnmadd231sd_avx512f(auVar31,auVar57,auVar28);
  auVar31 = vmulsd_avx512f(auVar26,auVar57);
  auVar32 = vfnmadd231sd_avx512f(auVar32,auVar26,auVar70);
  auVar34 = vfnmadd231sd_avx512f(auVar31,auVar27,auVar65);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = local_128.super_ChFrame<double>.coord.rot.m_data[0];
  auVar16._8_8_ = 0x8000000000000000;
  auVar16._0_8_ = 0x8000000000000000;
  auVar31 = vxorpd_avx512vl(auVar66,auVar16);
  auVar75._8_8_ = 0;
  auVar75._0_8_ =
       local_128.super_ChFrame<double>.coord.rot.m_data[0] *
       local_128.super_ChFrame<double>.coord.rot.m_data[0];
  auVar83._8_8_ = 0;
  auVar83._0_8_ =
       local_128.super_ChFrame<double>.coord.rot.m_data[2] *
       local_128.super_ChFrame<double>.coord.rot.m_data[2];
  auVar35 = vaddsd_avx512f(auVar75,auVar83);
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       local_128.super_ChFrame<double>.coord.rot.m_data[1] *
       local_128.super_ChFrame<double>.coord.rot.m_data[1];
  auVar36 = vaddsd_avx512f(auVar75,auVar78);
  auVar35 = vfmadd213sd_avx512f(auVar35,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  auVar36 = vfmadd213sd_avx512f(auVar36,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  dVar62 = auVar31._0_8_;
  dVar5 = local_128.super_ChFrame<double>.coord.rot.m_data[3] *
          local_128.super_ChFrame<double>.coord.rot.m_data[2] -
          local_128.super_ChFrame<double>.coord.rot.m_data[1] * dVar62;
  dVar4 = local_128.super_ChFrame<double>.coord.rot.m_data[1] * dVar62 +
          local_128.super_ChFrame<double>.coord.rot.m_data[3] *
          local_128.super_ChFrame<double>.coord.rot.m_data[2];
  dVar3 = local_128.super_ChFrame<double>.coord.rot.m_data[2] * dVar62 +
          local_128.super_ChFrame<double>.coord.rot.m_data[3] *
          local_128.super_ChFrame<double>.coord.rot.m_data[1];
  dVar15 = local_128.super_ChFrame<double>.coord.rot.m_data[3] *
           local_128.super_ChFrame<double>.coord.rot.m_data[1] -
           local_128.super_ChFrame<double>.coord.rot.m_data[2] * dVar62;
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       local_128.super_ChFrame<double>.coord.rot.m_data[1] *
       local_128.super_ChFrame<double>.coord.rot.m_data[2] -
       local_128.super_ChFrame<double>.coord.rot.m_data[3] * dVar62;
  auVar37 = vaddsd_avx512f(auVar67,auVar67);
  dVar62 = local_128.super_ChFrame<double>.coord.rot.m_data[1] *
           local_128.super_ChFrame<double>.coord.rot.m_data[2] +
           local_128.super_ChFrame<double>.coord.rot.m_data[3] * dVar62;
  dVar4 = dVar4 + dVar4;
  auVar38 = vmulsd_avx512f(auVar35,auVar30);
  auVar31 = vmulsd_avx512f(auVar32,auVar37);
  auVar35 = vmulsd_avx512f(auVar32,auVar35);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar4;
  auVar39 = vmulsd_avx512f(auVar81,auVar30);
  auVar86._8_8_ = 0;
  auVar86._0_8_ =
       local_128.super_ChFrame<double>.coord.rot.m_data[3] *
       local_128.super_ChFrame<double>.coord.rot.m_data[3] +
       local_128.super_ChFrame<double>.coord.rot.m_data[0] *
       local_128.super_ChFrame<double>.coord.rot.m_data[0];
  auVar40 = vfmadd213sd_avx512f(auVar86,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  auVar41 = vfmadd231sd_avx512f(auVar31,auVar36,auVar33);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar62 + dVar62;
  auVar31 = vfmadd231sd_fma(auVar35,auVar92,auVar33);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = auVar32._0_8_ * dVar4;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar15 + dVar15;
  auVar32 = vfmadd231sd_fma(auVar72,auVar90,auVar33);
  auVar33 = vmulsd_avx512f(auVar37,auVar30);
  auVar35 = vfnmsub231sd_avx512f(auVar38,auVar29,auVar92);
  auVar37 = vfnmsub231sd_avx512f(auVar39,auVar29,auVar90);
  auVar33 = vfnmsub231sd_avx512f(auVar33,auVar29,auVar36);
  if (((ulong)pdVar7 & 7) == 0) {
    uVar21 = -((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7;
    if (uVar21 < 3) {
      uVar23 = uVar21;
    }
    if (uVar21 != 0) goto LAB_0063df18;
  }
  else {
LAB_0063df18:
    auVar52 = vpbroadcastq_avx512f();
    uVar25 = vpcmpuq_avx512f(auVar52,_DAT_00970b40,5);
    auVar53._8_8_ =
         (ulong)((byte)(uVar25 >> 1) & 1) *
         (long)local_438.super_ChFrame<double>.coord.pos.m_data[0];
    auVar53._0_8_ = (ulong)((byte)uVar25 & 1) * (long)local_438.super_ChFrame<double>._vptr_ChFrame;
    auVar53._16_8_ =
         (ulong)((byte)(uVar25 >> 2) & 1) *
         (long)local_438.super_ChFrame<double>.coord.pos.m_data[1];
    auVar53._24_8_ =
         (ulong)((byte)(uVar25 >> 3) & 1) *
         (long)local_438.super_ChFrame<double>.coord.pos.m_data[2];
    auVar53._32_8_ =
         (ulong)((byte)(uVar25 >> 4) & 1) *
         (long)local_438.super_ChFrame<double>.coord.rot.m_data[0];
    auVar53._40_8_ =
         (ulong)((byte)(uVar25 >> 5) & 1) *
         (long)local_438.super_ChFrame<double>.coord.rot.m_data[1];
    auVar53._48_8_ =
         (ulong)((byte)(uVar25 >> 6) & 1) *
         (long)local_438.super_ChFrame<double>.coord.rot.m_data[2];
    auVar53._56_8_ = (uVar25 >> 7) * (long)local_438.super_ChFrame<double>.coord.rot.m_data[3];
    auVar52._8_8_ = 0x8000000000000000;
    auVar52._0_8_ = 0x8000000000000000;
    auVar52._16_8_ = 0x8000000000000000;
    auVar52._24_8_ = 0x8000000000000000;
    auVar52._32_8_ = 0x8000000000000000;
    auVar52._40_8_ = 0x8000000000000000;
    auVar52._48_8_ = 0x8000000000000000;
    auVar52._56_8_ = 0x8000000000000000;
    auVar52 = vxorpd_avx512dq(auVar53,auVar52);
    bVar8 = (bool)((byte)uVar25 & 1);
    bVar9 = (bool)((byte)(uVar25 >> 1) & 1);
    bVar10 = (bool)((byte)(uVar25 >> 2) & 1);
    bVar11 = (bool)((byte)(uVar25 >> 3) & 1);
    bVar12 = (bool)((byte)(uVar25 >> 4) & 1);
    bVar13 = (bool)((byte)(uVar25 >> 5) & 1);
    bVar14 = (bool)((byte)(uVar25 >> 6) & 1);
    *pdVar7 = (double)((ulong)bVar8 * auVar52._0_8_ | (ulong)!bVar8 * (long)*pdVar7);
    pdVar7[1] = (double)((ulong)bVar9 * auVar52._8_8_ | (ulong)!bVar9 * (long)pdVar7[1]);
    pdVar7[2] = (double)((ulong)bVar10 * auVar52._16_8_ | (ulong)!bVar10 * (long)pdVar7[2]);
    pdVar7[3] = (double)((ulong)bVar11 * auVar52._24_8_ | (ulong)!bVar11 * (long)pdVar7[3]);
    pdVar7[4] = (double)((ulong)bVar12 * auVar52._32_8_ | (ulong)!bVar12 * (long)pdVar7[4]);
    pdVar7[5] = (double)((ulong)bVar13 * auVar52._40_8_ | (ulong)!bVar13 * (long)pdVar7[5]);
    pdVar7[6] = (double)((ulong)bVar14 * auVar52._48_8_ | (ulong)!bVar14 * (long)pdVar7[6]);
    pdVar7[7] = (double)((uVar25 >> 7) * auVar52._56_8_ |
                        (ulong)!SUB81(uVar25 >> 7,0) * (long)pdVar7[7]);
  }
  auVar89._8_8_ = 0;
  auVar89._0_8_ = local_460;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar3 + dVar3;
  auVar36 = vfmadd231sd_fma(auVar41,auVar79,auVar34);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar5 + dVar5;
  auVar31 = vfmadd231sd_fma(auVar31,auVar84,auVar34);
  auVar32 = vfmadd231sd_fma(auVar32,auVar40,auVar34);
  auVar33 = vfnmadd231sd_fma(auVar33,auVar89,auVar79);
  auVar34 = vfnmadd231sd_fma(auVar35,auVar89,auVar84);
  auVar35 = vfnmadd231sd_fma(auVar37,auVar89,auVar40);
  if (uVar23 < 3) {
    uVar20 = (ulong)(uVar23 << 3);
    auVar50 = vpbroadcastq_avx512vl();
    uVar25 = vpcmpuq_avx512vl(auVar50,_DAT_00955380,5);
    uVar25 = uVar25 & 0xf;
    auVar51._8_8_ =
         (ulong)((byte)(uVar25 >> 1) & 1) *
         *(long *)((long)local_438.super_ChFrame<double>.coord.pos.m_data + uVar20);
    auVar51._0_8_ =
         (ulong)((byte)uVar25 & 1) *
         *(long *)((long)local_438.super_ChFrame<double>.coord.pos.m_data + (uVar20 - 8));
    auVar51._16_8_ =
         (ulong)((byte)(uVar25 >> 2) & 1) *
         *(long *)((long)local_438.super_ChFrame<double>.coord.pos.m_data + uVar20 + 8);
    auVar51._24_8_ =
         (uVar25 >> 3) *
         *(long *)((long)local_438.super_ChFrame<double>.coord.pos.m_data + uVar20 + 0x10);
    auVar50._8_8_ = 0x8000000000000000;
    auVar50._0_8_ = 0x8000000000000000;
    auVar50._16_8_ = 0x8000000000000000;
    auVar50._24_8_ = 0x8000000000000000;
    auVar50 = vxorpd_avx512vl(auVar51,auVar50);
    puVar2 = (ulong *)((long)pdVar7 + uVar20);
    bVar8 = (bool)((byte)uVar25 & 1);
    bVar9 = (bool)((byte)(uVar25 >> 1) & 1);
    bVar10 = (bool)((byte)(uVar25 >> 2) & 1);
    *puVar2 = (ulong)bVar8 * auVar50._0_8_ | (ulong)!bVar8 * *puVar2;
    puVar2[1] = (ulong)bVar9 * auVar50._8_8_ | (ulong)!bVar9 * puVar2[1];
    puVar2[2] = (ulong)bVar10 * auVar50._16_8_ | (ulong)!bVar10 * puVar2[2];
    puVar2[3] = (uVar25 >> 3) * auVar50._24_8_ | (ulong)!SUB81(uVar25 >> 3,0) * puVar2[3];
  }
  local_480.m_data[0] = auVar36._0_8_ + auVar33._0_8_;
  local_480.m_data[1] = auVar31._0_8_ + auVar34._0_8_;
  local_480.m_data[2] = auVar32._0_8_ + auVar35._0_8_;
  if ((long)uVar22 < 6) goto LAB_0063e458;
  pdVar1 = pdVar7 + 3;
  uVar23 = 3;
  vmovsd_avx512f(auVar29);
  vmovsd_avx512f(auVar30);
  vmovsd_avx512f(auVar26);
  vmovsd_avx512f(auVar27);
  vmovsd_avx512f(auVar28);
  if (((ulong)pdVar1 & 7) == 0) {
    uVar21 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if (uVar21 < 3) {
      uVar23 = uVar21;
    }
    if (uVar21 != 0) goto LAB_0063e020;
  }
  else {
LAB_0063e020:
    memcpy(pdVar1,&local_480,(ulong)(uVar23 * 8));
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_4b0;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_4a8;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_4a0;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_498;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_490;
  }
  if (uVar23 < 3) {
    uVar25 = (ulong)(uVar23 << 3);
    memcpy((void *)((long)pdVar7 + uVar25 + 0x18),(void *)((long)local_480.m_data + uVar25),
           0x18 - uVar25);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_4b0;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_4a8;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_4a0;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_498;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_490;
  }
  if (uVar22 < 9) goto LAB_0063e458;
  auVar34 = ZEXT816(0xbff0000000000000);
  auVar35 = ZEXT816(0x4000000000000000);
  pdVar1 = pdVar7 + 6;
  uVar23 = 3;
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[1] -
       local_220.super_ChFrame<double>.coord.pos.m_data[1];
  auVar31 = vmulsd_avx512f(auVar26,auVar68);
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[0] -
       local_220.super_ChFrame<double>.coord.pos.m_data[0];
  auVar32 = vmulsd_avx512f(auVar28,auVar58);
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[2] -
       local_220.super_ChFrame<double>.coord.pos.m_data[2];
  auVar33 = vmulsd_avx512f(auVar27,auVar71);
  auVar42 = vfmsub231sd_avx512f(auVar31,auVar58,auVar27);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = local_220.super_ChFrame<double>.coord.rot.m_data[0];
  auVar28 = vfmsub231sd_avx512f(auVar33,auVar68,auVar28);
  auVar31 = vfmsub231sd_avx512f(auVar32,auVar26,auVar71);
  local_220.super_ChFrame<double>.coord.rot.m_data[0] =
       local_220.super_ChFrame<double>.coord.rot.m_data[0] *
       local_220.super_ChFrame<double>.coord.rot.m_data[0];
  auVar17._8_8_ = 0x8000000000000000;
  auVar17._0_8_ = 0x8000000000000000;
  auVar32 = vxorpd_avx512vl(auVar59,auVar17);
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       local_220.super_ChFrame<double>.coord.rot.m_data[0] +
       local_220.super_ChFrame<double>.coord.rot.m_data[2] *
       local_220.super_ChFrame<double>.coord.rot.m_data[2];
  auVar26 = vfmadd213sd_fma(auVar82,auVar35,auVar34);
  auVar76._8_8_ = 0;
  auVar76._0_8_ =
       local_220.super_ChFrame<double>.coord.rot.m_data[0] +
       local_220.super_ChFrame<double>.coord.rot.m_data[1] *
       local_220.super_ChFrame<double>.coord.rot.m_data[1];
  auVar27 = vfmadd213sd_fma(auVar76,auVar35,auVar34);
  auVar87._8_8_ = 0;
  auVar87._0_8_ =
       local_220.super_ChFrame<double>.coord.rot.m_data[3] *
       local_220.super_ChFrame<double>.coord.rot.m_data[3] +
       local_220.super_ChFrame<double>.coord.rot.m_data[0];
  auVar88 = vfmadd213sd_fma(auVar87,auVar35,auVar34);
  dVar54 = auVar32._0_8_;
  dVar5 = local_220.super_ChFrame<double>.coord.rot.m_data[1] *
          local_220.super_ChFrame<double>.coord.rot.m_data[2] -
          local_220.super_ChFrame<double>.coord.rot.m_data[3] * dVar54;
  dVar3 = local_220.super_ChFrame<double>.coord.rot.m_data[1] *
          local_220.super_ChFrame<double>.coord.rot.m_data[2] +
          local_220.super_ChFrame<double>.coord.rot.m_data[3] * dVar54;
  dVar4 = local_220.super_ChFrame<double>.coord.rot.m_data[3] *
          local_220.super_ChFrame<double>.coord.rot.m_data[2] -
          local_220.super_ChFrame<double>.coord.rot.m_data[1] * dVar54;
  dVar62 = local_220.super_ChFrame<double>.coord.rot.m_data[1] * dVar54 +
           local_220.super_ChFrame<double>.coord.rot.m_data[3] *
           local_220.super_ChFrame<double>.coord.rot.m_data[2];
  dVar15 = local_220.super_ChFrame<double>.coord.rot.m_data[3] *
           local_220.super_ChFrame<double>.coord.rot.m_data[1] -
           local_220.super_ChFrame<double>.coord.rot.m_data[2] * dVar54;
  dVar62 = dVar62 + dVar62;
  auVar93._8_8_ = 0;
  auVar93._0_8_ =
       local_220.super_ChFrame<double>.coord.rot.m_data[2] * dVar54 +
       local_220.super_ChFrame<double>.coord.rot.m_data[3] *
       local_220.super_ChFrame<double>.coord.rot.m_data[1];
  auVar43 = vaddsd_avx512f(auVar93,auVar93);
  dVar4 = dVar4 + dVar4;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar5 + dVar5;
  auVar32 = vmulsd_avx512f(auVar31,auVar85);
  auVar33 = vmulsd_avx512f(auVar30,auVar85);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar3 + dVar3;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = auVar31._0_8_ * auVar26._0_8_;
  auVar95 = vfmadd231sd_fma(auVar94,auVar60,auVar28);
  auVar44 = vfmadd231sd_avx512f(auVar32,auVar27,auVar28);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar15 + dVar15;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = auVar31._0_8_ * dVar62;
  auVar74 = vfmadd231sd_fma(auVar73,auVar69,auVar28);
  auVar26 = vmulsd_avx512f(auVar30,auVar26);
  auVar45 = vfmadd231sd_avx512f(auVar33,auVar29,auVar27);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar62;
  auVar27 = vmulsd_avx512f(auVar30,auVar80);
  auVar46 = vfmadd231sd_avx512f(auVar26,auVar29,auVar60);
  auVar47 = vfmadd231sd_avx512f(auVar27,auVar69,auVar29);
  if (((ulong)pdVar1 & 7) == 0) {
    uVar21 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if (uVar21 < 3) {
      uVar23 = uVar21;
    }
    if (uVar21 != 0) goto LAB_0063e231;
  }
  else {
LAB_0063e231:
    vmovsd_avx512f(auVar44);
    vmovsd_avx512f(auVar42);
    vmovsd_avx512f(auVar43);
    local_458 = auVar88._0_8_;
    local_450 = dVar4;
    memcpy(pdVar1,&local_438,(ulong)(uVar23 * 8));
    auVar88._8_8_ = 0;
    auVar88._0_8_ = local_458;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_448;
    auVar47._8_8_ = 0;
    auVar46._8_8_ = 0;
    auVar45._8_8_ = 0;
    auVar74._8_8_ = 0;
    auVar95._8_8_ = 0;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_440;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_490;
    dVar4 = local_450;
  }
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar4;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_460;
  auVar48 = vfmadd231sd_avx512f(auVar44,auVar43,auVar42);
  auVar28 = vfmadd231sd_avx512f(auVar95,auVar91,auVar42);
  auVar31 = vfmadd231sd_avx512f(auVar74,auVar88,auVar42);
  auVar49 = vfmadd231sd_avx512f(auVar45,auVar61,auVar43);
  auVar26 = vfmadd231sd_fma(auVar46,auVar61,auVar91);
  auVar27 = vfmadd231sd_fma(auVar47,auVar88,auVar61);
  if (uVar23 < 3) {
    uVar25 = (ulong)(uVar23 << 3);
    vmovsd_avx512f(auVar48);
    memcpy((void *)((long)pdVar7 + uVar25 + 0x30),
           (void *)((long)local_438.super_ChFrame<double>.coord.pos.m_data + (uVar25 - 8)),
           0x18 - uVar25);
    auVar49._8_8_ = 0;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_490;
  }
  auVar32 = vaddsd_avx512f(auVar48,auVar49);
  local_480.m_data[1] = auVar28._0_8_ + auVar26._0_8_;
  local_480.m_data[2] = auVar31._0_8_ + auVar27._0_8_;
  local_480.m_data[0] = auVar32._0_8_;
  if (uVar22 < 0xc) {
LAB_0063e458:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar1 = pdVar7 + 9;
  uVar23 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar21 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if (uVar21 < 3) {
      uVar23 = uVar21;
    }
    if (uVar21 == 0) goto LAB_0063e3cb;
  }
  memcpy(pdVar1,&local_480,(ulong)(uVar23 * 8));
LAB_0063e3cb:
  if (uVar23 < 3) {
    uVar22 = (ulong)(uVar23 << 3);
    memcpy((void *)((long)pdVar7 + uVar22 + 0x48),(void *)((long)local_480.m_data + uVar22),
           0x18 - uVar22);
  }
  if (local_4c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4c0);
  }
  if (local_4b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4b8);
  }
  return;
}

Assistant:

void ChLoadXYZROTnodeXYZROTnode::ComputeQ(ChState* state_x, ChStateDelta* state_w) {
    auto mbodyA = std::dynamic_pointer_cast<ChBody>(this->loadables[0]);
    auto mbodyB = std::dynamic_pointer_cast<ChBody>(this->loadables[1]);

    ChFrameMoving<> bodycoordA, bodycoordB;
    if (state_x) {
        // the numerical jacobian algo might change state_x
        bodycoordA.SetCoord(state_x->segment(0, 7));
        bodycoordB.SetCoord(state_x->segment(7, 7));
    } else {
        bodycoordA.SetCoord(mbodyA->coord);
        bodycoordB.SetCoord(mbodyB->coord);
    }

    if (state_w) {
        // the numerical jacobian algo might change state_w
        bodycoordA.SetPos_dt(state_w->segment(0, 3));
        bodycoordA.SetWvel_loc(state_w->segment(3, 3));
        bodycoordB.SetPos_dt(state_w->segment(6, 3));
        bodycoordB.SetWvel_loc(state_w->segment(9, 3));
    } else {
        bodycoordA.SetCoord_dt(mbodyA->GetCoord_dt());
        bodycoordB.SetCoord_dt(mbodyB->GetCoord_dt());
    }

    frame_Aw = ChFrameMoving<>(loc_application_A) >> bodycoordA;
    frame_Bw = ChFrameMoving<>(loc_application_B) >> bodycoordB;
    ChFrameMoving<> rel_AB = frame_Aw >> frame_Bw.GetInverse();

    // COMPUTE THE FORCE

    ComputeForceTorque(rel_AB, locB_force, locB_torque);

    ChVector<> abs_force = frame_Bw.TransformDirectionLocalToParent(locB_force);
    ChVector<> abs_torque = frame_Bw.TransformDirectionLocalToParent(locB_torque);

    // Compute Q

    ChVector<> loc_ftorque = bodycoordA.GetRot().RotateBack(((frame_Aw.GetPos() - bodycoordA.GetPos()) % -abs_force));
    ChVector<> loc_torque = bodycoordA.GetRot().RotateBack(-abs_torque);
    load_Q.segment(0, 3) = -abs_force.eigen();
    load_Q.segment(3, 3) = (loc_ftorque + loc_torque).eigen();

    loc_ftorque = bodycoordB.GetRot().RotateBack(((frame_Bw.GetPos() - bodycoordB.GetPos()) % abs_force));
    loc_torque = bodycoordB.GetRot().RotateBack(abs_torque);
    load_Q.segment(6, 3) = abs_force.eigen();
    load_Q.segment(9, 3) = (loc_ftorque + loc_torque).eigen();
}